

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O2

int mm_write_banner(FILE *f,char *matcode)

{
  int iVar1;
  int iVar2;
  char *__ptr;
  
  __ptr = mm_typecode_to_str(matcode);
  iVar1 = fprintf((FILE *)f,"%s %s\n","%%MatrixMarket",__ptr);
  free(__ptr);
  iVar2 = 0x11;
  if (iVar1 == 2) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mm_write_banner(FILE *f, MM_typecode matcode) {
    char *str = mm_typecode_to_str(matcode);
    int ret_code;

    ret_code = fprintf(f, "%s %s\n", MatrixMarketBanner, str);
    free(str);
    if (ret_code != 2)
        return MM_COULD_NOT_WRITE_FILE;
    else
        return 0;
}